

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_PostScript.cxx
# Opt level: O1

void __thiscall Fl_PostScript_Graphics_Driver::font(Fl_PostScript_Graphics_Driver *this,int f,int s)

{
  Fl_Graphics_Driver *pFVar1;
  Fl_Font_Descriptor *pFVar2;
  Fl_Display_Device *pFVar3;
  char *pcVar4;
  float ps_size;
  undefined1 local_24 [4];
  
  pFVar3 = Fl_Display_Device::display_device();
  pFVar1 = (pFVar3->super_Fl_Surface_Device)._driver;
  (*(pFVar1->super_Fl_Device)._vptr_Fl_Device[0x36])(pFVar1,f,(ulong)(uint)s);
  (this->super_Fl_Graphics_Driver).font_ = f;
  (this->super_Fl_Graphics_Driver).size_ = s;
  pFVar2 = pFVar1->font_descriptor_;
  (this->super_Fl_Graphics_Driver).font_descriptor_ = pFVar2;
  if (f < 0x10) {
    fprintf((FILE *)this->output,"/%s SF\n",
            _ZL10_fontNames_rel + *(int *)(_ZL10_fontNames_rel + (long)f * 4));
    pcVar4 = strstr(*pFVar2->font->font_name_list,"--");
    if (pcVar4 != (char *)0x0) {
      __isoc99_sscanf(pcVar4 + 2,"%f",local_24);
    }
    clocale_printf(this,"%.1f FS\n",(double)s);
  }
  return;
}

Assistant:

void Fl_PostScript_Graphics_Driver::font(int f, int s) {
  Fl_Graphics_Driver *driver = Fl_Display_Device::display_device()->driver();
  driver->font(f,s); // Use display fonts for font measurement
  Fl_Graphics_Driver::font(f, s);
  Fl_Font_Descriptor *desc = driver->font_descriptor();
  this->font_descriptor(desc);
  if (f < FL_FREE_FONT) {
    float ps_size = (float) s;
    fprintf(output, "/%s SF\n" , _fontNames[f]);
#if defined(USE_X11) 
#if USE_XFT
    // Xft font height is sometimes larger than the required size (see STR 2566).
    // Increase the PostScript font size by 15% without exceeding the display font height 
    int max = desc->font->height;
    ps_size = s * 1.15;
    if (ps_size > max) ps_size = max;
#else
    // Non-Xft fonts can be smaller than required.
    // Set the PostScript font size to the display font height 
    char *name = desc->font->font_name_list[0];
    char *p = strstr(name, "--");
    if (p) {
      sscanf(p + 2, "%f", &ps_size);
    }
#endif // USE_XFT
#endif // USE_X11
    clocale_printf("%.1f FS\n", ps_size);
  }
}